

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

Matrix6x1 * __thiscall
iDynTree::BerdyHelper::getBiasTermJointAccelerationPropagation
          (BerdyHelper *this,IJointConstPtr joint,LinkIndex parentLinkIdx,LinkIndex childLinkIdx,
          Transform *child_X_parent)

{
  uint uVar1;
  SpatialVector<iDynTree::SpatialMotionVector> *this_00;
  AngularVector3T *pAVar2;
  Rotation *pRVar3;
  Position *pPVar4;
  long lVar5;
  double *pdVar6;
  long in_RCX;
  long *in_RDX;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  undefined8 in_R8;
  Matrix6x1 *biasTerm;
  SpatialMotionVector Smixed;
  SpatialMotionVector SleftTrivialzed;
  size_t localDof;
  Twist relJointVelInMixed;
  Transform mixed_X_leftTrivialized;
  Rotation parent_R_child;
  Position parent_o_child;
  Transform parent_X_child;
  Rotation child_R_parent;
  Vector3 parentBodyAngularVel;
  Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_> biasTermEig;
  VectorDynSize *in_stack_fffffffffffffa68;
  Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
  *this_01;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>_>
  *in_stack_fffffffffffffa90;
  StorageBaseType *in_stack_fffffffffffffab0;
  int *in_stack_fffffffffffffab8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffb00;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffb08;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffb10;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffb18;
  SpatialMotionVector local_328;
  Twist local_2f8 [48];
  Twist local_2c8 [48];
  Transform local_298 [48];
  undefined1 local_268 [48];
  Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
  *local_238;
  SpatialMotionVector local_230;
  SpatialVector<iDynTree::SpatialMotionVector> local_200;
  Position local_1d0 [24];
  SpatialMotionVector local_1b8 [2];
  Rotation local_158 [72];
  Position local_110 [120];
  Rotation local_98 [72];
  double local_50;
  double local_48;
  double local_40;
  undefined8 local_20;
  long local_18;
  long *local_10;
  
  other = in_RDI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  MatrixFixSize<6U,_1U>::MatrixFixSize((MatrixFixSize<6U,_1U> *)in_RDI);
  MatrixFixSize<6U,_1U>::zero((MatrixFixSize<6U,_1U> *)in_stack_fffffffffffffa90);
  toEigen<6U>((MatrixFixSize<6U,_1U> *)in_RSI);
  this_00 = (SpatialVector<iDynTree::SpatialMotionVector> *)
            iDynTree::LinkVelArray::operator()((LinkVelArray *)(in_RSI + 0x250),local_18);
  pAVar2 = SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(this_00);
  local_50 = (pAVar2->super_Vector3).m_data[0];
  local_48 = (pAVar2->super_Vector3).m_data[1];
  local_40 = (pAVar2->super_Vector3).m_data[2];
  pRVar3 = (Rotation *)iDynTree::Transform::getRotation();
  iDynTree::Rotation::Rotation(local_98,pRVar3);
  iDynTree::Transform::inverse();
  pPVar4 = (Position *)iDynTree::Transform::getPosition();
  iDynTree::Position::Position(local_110,pPVar4);
  pRVar3 = (Rotation *)iDynTree::Transform::getRotation();
  iDynTree::Rotation::Rotation(local_158,pRVar3);
  iDynTree::Position::Zero();
  iDynTree::Transform::Transform((Transform *)local_1b8,local_158,local_1d0);
  SpatialVector<iDynTree::SpatialMotionVector>::Zero();
  iDynTree::Twist::Twist((Twist *)&local_200,&local_230);
  local_238 = (Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
               *)0x0;
  while( true ) {
    this_01 = local_238;
    uVar1 = (**(code **)(*local_10 + 0x20))();
    if ((Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
         *)(ulong)uVar1 <= this_01) break;
    (**(code **)(*local_10 + 0x60))
              (local_268,local_10,(ulong)local_238 & 0xffffffff,local_20,local_18);
    iDynTree::Transform::operator*(local_298,local_1b8);
    in_stack_fffffffffffffa68 = (VectorDynSize *)(in_RSI + 0x230);
    lVar5 = (**(code **)(*local_10 + 0xc0))();
    pdVar6 = (double *)
             iDynTree::VectorDynSize::operator()
                       (in_stack_fffffffffffffa68,
                        (long)&(local_238->
                               super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
                               ).
                               super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
                               .
                               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_1>
                               .
                               super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
                               .m_data + lVar5);
    iDynTree::SpatialMotionVector::operator*(&local_328,*pdVar6);
    iDynTree::Twist::Twist(local_2f8,&local_328);
    iDynTree::Twist::operator+(local_2c8,(Twist *)&local_200);
    iDynTree::Twist::operator=((Twist *)&local_200,local_2c8);
    local_238 = (Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>
                 *)((long)&(local_238->
                           super_BlockImpl<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_Eigen::Dense>
                           ).
                           super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>,_3,_1,_false>,_0>
                           .m_data + 1);
  }
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_RSI);
  Eigen::operator*(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(&local_200);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>const>>
  ::operator*(in_RSI,other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  segment<3>((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)in_RDI);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>::
  operator=(this_01,(DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                     *)in_stack_fffffffffffffa68);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_RSI);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  SpatialVector<iDynTree::SpatialMotionVector>::getAngularVec3(&local_200);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  segment<3>((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)in_RDI);
  Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>::
  operator=(this_01,(DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                     *)in_stack_fffffffffffffa68);
  toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)in_RSI);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  toEigen<3U>((VectorFixSize<3U> *)in_RSI);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Matrix<double,3,1,0,3,1>>(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,other);
  Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>::
  segment<3>((DenseBase<Eigen::Map<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_RSI,(Index)other,(Index)in_RDI);
  Eigen::
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>,0,Eigen::Stride<0,0>>,3,1,false>>
  ::operator+=(in_stack_fffffffffffffa90,
               (MatrixBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_RSI);
  return (Matrix6x1 *)in_RDI;
}

Assistant:

Matrix6x1 BerdyHelper::getBiasTermJointAccelerationPropagation(IJointConstPtr joint,
                                                               const LinkIndex parentLinkIdx,
                                                               const LinkIndex childLinkIdx,
                                                               const Transform &child_X_parent)
{
    Matrix6x1 biasTerm;
    biasTerm.zero();

    auto biasTermEig = toEigen(biasTerm);

    // Implementing equation 36 in https://www.sharelatex.com/project/59439ec80788901873a803fb
    Vector3 parentBodyAngularVel = m_linkVels(parentLinkIdx).getAngularVec3();

    Rotation  child_R_parent = child_X_parent.getRotation();
    Transform parent_X_child = child_X_parent.inverse();
    Position  parent_o_child = parent_X_child.getPosition();
    Rotation  parent_R_child = parent_X_child.getRotation();
    Transform mixed_X_leftTrivialized = Transform(parent_R_child, Position::Zero());

    // Compute the mixed relative velocity of the child w.r.t to the parent
    Twist relJointVelInMixed = Twist::Zero();
    for (size_t localDof=0; localDof < joint->getNrOfDOFs(); localDof++)
    {
        SpatialMotionVector SleftTrivialzed = joint->getMotionSubspaceVector(localDof, childLinkIdx, parentLinkIdx);
        SpatialMotionVector Smixed = mixed_X_leftTrivialized*SleftTrivialzed;

        relJointVelInMixed = relJointVelInMixed + (Smixed*m_jointVel(joint->getDOFsOffset()+localDof));
    }

    // Compute the first term
    biasTermEig.segment<3>(0) = 2*toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(relJointVelInMixed.getLinearVec3())));
    biasTermEig.segment<3>(3) = toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(relJointVelInMixed.getAngularVec3())));

    // Compute the second term
    biasTermEig.segment<3>(0) += toEigen(child_R_parent)*(toEigen(parentBodyAngularVel).cross(toEigen(parentBodyAngularVel).cross(toEigen(parent_o_child))));

    return biasTerm;
}